

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msocket.c
# Opt level: O0

int8_t msocket_start_io(msocket_t *self)

{
  int *piVar1;
  msocket_t *self_local;
  
  if (self == (msocket_t *)0x0) {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
    self_local._7_1_ = -1;
  }
  else if (self->handlerTable == (msocket_handler_t *)0x0) {
    piVar1 = __errno_location();
    *piVar1 = 0xe;
    self_local._7_1_ = -1;
  }
  else {
    self_local._7_1_ = msocket_startIoThread(self);
  }
  return self_local._7_1_;
}

Assistant:

int8_t msocket_start_io(msocket_t *self){
   if(self != 0) {
      if (self->handlerTable == 0) {
         //Cannot start I/O thread without first setting up handler table
         errno = EFAULT;
         return -1;
      }
      return (int8_t) msocket_startIoThread(self);
   }
   errno=EINVAL;
   return -1;
}